

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString BracketsFormattedHexStringFrom(int value)

{
  size_t extraout_RDX;
  undefined4 in_register_0000003c;
  SimpleString SVar1;
  SimpleString local_20;
  
  HexStringFrom((int)&local_20);
  BracketsFormattedHexString((SimpleString *)CONCAT44(in_register_0000003c,value));
  SimpleString::~SimpleString(&local_20);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)CONCAT44(in_register_0000003c,value);
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}